

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall
re2::BitState::Search
          (BitState *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  undefined8 *puVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint __c;
  long lVar6;
  byte *p0;
  long lVar7;
  byte *pbVar8;
  char *p;
  ulong uVar9;
  __uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter> _Stack_38;
  
  sVar2 = text->size_;
  (this->text_).data_ = text->data_;
  (this->text_).size_ = sVar2;
  sVar2 = context->size_;
  (this->context_).data_ = context->data_;
  (this->context_).size_ = sVar2;
  if ((this->context_).data_ == (const_pointer)0x0) {
    sVar2 = text->size_;
    (this->context_).data_ = text->data_;
    (this->context_).size_ = sVar2;
  }
  bVar3 = this->prog_->anchor_start_;
  if (((bVar3 == true) && ((this->context_).data_ != text->data_)) ||
     ((bVar4 = this->prog_->anchor_end_, bVar4 == true &&
      ((this->context_).data_ + (this->context_).size_ != text->data_ + text->size_)))) {
    bVar3 = false;
  }
  else {
    if (anchored) {
      bVar3 = true;
    }
    this->anchored_ = bVar3;
    bVar3 = bVar4;
    if (longest) {
      bVar3 = true;
    }
    this->longest_ = bVar3;
    this->endmatch_ = bVar4;
    this->submatch_ = submatch;
    this->nsubmatch_ = nsubmatch;
    lVar6 = 0;
    iVar5 = nsubmatch;
    for (lVar7 = 0; lVar7 < iVar5; lVar7 = lVar7 + 1) {
      puVar1 = (undefined8 *)((long)&this->submatch_->data_ + lVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      iVar5 = this->nsubmatch_;
      lVar6 = lVar6 + 0x10;
    }
    iVar5 = (((int)text->size_ + 1) * this->prog_->list_count_ + 0x1f) / 0x20;
    PODArray<unsigned_int>::PODArray((PODArray<unsigned_int> *)&_Stack_38,iVar5);
    std::__uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>::operator=
              ((__uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter> *)
               &this->visited_,
               (__uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter> *)&_Stack_38);
    std::unique_ptr<unsigned_int[],_re2::PODArray<unsigned_int>::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_int[],_re2::PODArray<unsigned_int>::Deleter> *)&_Stack_38);
    memset((this->visited_).ptr_._M_t.
           super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,0,(long)iVar5 << 2);
    uVar9 = 2;
    if (2 < nsubmatch * 2) {
      uVar9 = (ulong)(uint)(nsubmatch * 2);
    }
    PODArray<const_char_*>::PODArray((PODArray<const_char_*> *)&_Stack_38,(int)uVar9);
    std::__uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>::operator=
              ((__uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter> *)&this->cap_,
               &_Stack_38);
    std::unique_ptr<const_char_*[],_re2::PODArray<const_char_*>::Deleter>::~unique_ptr
              ((unique_ptr<const_char_*[],_re2::PODArray<const_char_*>::Deleter> *)&_Stack_38);
    memset((this->cap_).ptr_._M_t.
           super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
           super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
           super__Head_base<0UL,_const_char_**,_false>._M_head_impl,0,uVar9 << 3);
    PODArray<re2::Job>::PODArray((PODArray<re2::Job> *)&_Stack_38,0x40);
    std::__uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>::operator=
              ((__uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter> *)&this->job_,
               (__uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter> *)&_Stack_38);
    std::unique_ptr<re2::Job[],_re2::PODArray<re2::Job>::Deleter>::~unique_ptr
              ((unique_ptr<re2::Job[],_re2::PODArray<re2::Job>::Deleter> *)&_Stack_38);
    p0 = (byte *)text->data_;
    if (this->anchored_ == false) {
      do {
        bVar3 = p0 <= text->data_ + text->size_;
        if (text->data_ + text->size_ < p0) {
          return bVar3;
        }
        __c = Prog::first_byte(this->prog_);
        if ((((-1 < (int)__c) && (pbVar8 = (byte *)(text->data_ + text->size_), p0 < pbVar8)) &&
            (__c != *p0)) &&
           (p0 = (byte *)memchr(p0,__c,(long)pbVar8 - (long)p0), p0 == (byte *)0x0)) {
          p0 = pbVar8;
        }
        *(this->cap_).ptr_._M_t.
         super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
         super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
         super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char *)p0;
        bVar4 = TrySearch(this,this->prog_->start_,(char *)p0);
        p0 = p0 + 1;
      } while (!bVar4);
    }
    else {
      *(this->cap_).ptr_._M_t.
       super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char *)p0;
      bVar3 = TrySearch(this,this->prog_->start_,(char *)p0);
    }
  }
  return bVar3;
}

Assistant:

bool BitState::Search(const StringPiece& text, const StringPiece& context,
                      bool anchored, bool longest,
                      StringPiece* submatch, int nsubmatch) {
  // Search parameters.
  text_ = text;
  context_ = context;
  if (context_.data() == NULL)
    context_ = text;
  if (prog_->anchor_start() && context_.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context_.end() != text.end())
    return false;
  anchored_ = anchored || prog_->anchor_start();
  longest_ = longest || prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  for (int i = 0; i < nsubmatch_; i++)
    submatch_[i] = StringPiece();

  // Allocate scratch space.
  int nvisited = prog_->list_count() * static_cast<int>(text.size()+1);
  nvisited = (nvisited + VisitedBits-1) / VisitedBits;
  visited_ = PODArray<uint32_t>(nvisited);
  memset(visited_.data(), 0, nvisited*sizeof visited_[0]);

  int ncap = 2*nsubmatch;
  if (ncap < 2)
    ncap = 2;
  cap_ = PODArray<const char*>(ncap);
  memset(cap_.data(), 0, ncap*sizeof cap_[0]);

  // When sizeof(Job) == 16, we start with a nice round 1KiB. :)
  job_ = PODArray<Job>(64);

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.data();
    return TrySearch(prog_->start(), text.data());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  // This looks like it's quadratic in the size of the text,
  // but we are not clearing visited_ between calls to TrySearch,
  // so no work is duplicated and it ends up still being linear.
  for (const char* p = text.data(); p <= text.data() + text.size(); p++) {
    // Try to use memchr to find the first byte quickly.
    int fb = prog_->first_byte();
    if (fb >= 0 && p < text.data() + text.size() && (p[0] & 0xFF) != fb) {
      p = reinterpret_cast<const char*>(
          memchr(p, fb, text.data() + text.size() - p));
      if (p == NULL)
        p = text.data() + text.size();
    }

    cap_[0] = p;
    if (TrySearch(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}